

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderProgram
          (GLShaderProgram *this,
          shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram> *compiledProgram_)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  ShaderProgram::ShaderProgram
            (&this->super_ShaderProgram,
             ((compiledProgram_->
              super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->drawMode);
  (this->super_ShaderProgram)._vptr_ShaderProgram = (_func_int **)&PTR__GLShaderProgram_005fa3c0;
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderUniform>_>
  ::vector(&this->uniforms,
           &((compiledProgram_->
             super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr)->uniforms);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute>_>
  ::vector(&this->attributes,
           &((compiledProgram_->
             super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr)->attributes);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
  ::vector(&this->textures,
           &((compiledProgram_->
             super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr)->textures);
  p_Var1 = (compiledProgram_->
           super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  p_Var2 = (compiledProgram_->
           super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->compiledProgram).
  super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (compiledProgram_->
            super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  (this->compiledProgram).
  super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (*glad_glGenVertexArrays)(1,&this->vaoHandle);
  checkGLError(true);
  createBuffers(this);
  checkGLError(true);
  return;
}

Assistant:

GLShaderProgram::GLShaderProgram(const std::shared_ptr<GLCompiledProgram>& compiledProgram_)
    : ShaderProgram(compiledProgram_->getDrawMode()), uniforms(compiledProgram_->getUniforms()),
      attributes(compiledProgram_->getAttributes()), textures(compiledProgram_->getTextures()),
      compiledProgram(compiledProgram_) {

  // Create a VAO
  glGenVertexArrays(1, &vaoHandle);
  checkGLError();

  createBuffers(); // only handles texture & index things, attributes are lazily created
  checkGLError();
}